

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

BOOL UnmapViewOfFile(LPCVOID lpBaseAddress)

{
  PAL_ERROR dwLastError;
  CPalThread *pThread_00;
  CPalThread *pThread;
  PAL_ERROR palError;
  LPCVOID lpBaseAddress_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pThread_00 = CorUnix::InternalGetCurrentThread();
  dwLastError = CorUnix::InternalUnmapViewOfFile(pThread_00,lpBaseAddress);
  if (dwLastError != 0) {
    CorUnix::CPalThread::SetLastError(dwLastError);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return (BOOL)(dwLastError == 0);
}

Assistant:

BOOL
PALAPI
UnmapViewOfFile(
        IN LPCVOID lpBaseAddress)
{
    PAL_ERROR palError;
    CPalThread *pThread;
    
    PERF_ENTRY(UnmapViewOfFile);
    ENTRY("UnmapViewOfFile(lpBaseAddress=%p)\n", lpBaseAddress);

    pThread = InternalGetCurrentThread();

    palError = InternalUnmapViewOfFile(pThread, lpBaseAddress);

    if (NO_ERROR != palError)
    {
        pThread->SetLastError(palError);
    }
    
    LOGEXIT( "UnmapViewOfFile returning %s.\n", (NO_ERROR == palError) ? "TRUE" : "FALSE" );
    PERF_EXIT(UnmapViewOfFile);
    return (NO_ERROR == palError);
}